

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::MultipoleAtomTypesSectionParser::parseDipole
          (MultipoleAtomTypesSectionParser *this,StringTokenizer *tokenizer,RealType *dipoleMoment,
          int lineNo)

{
  bool bVar1;
  RealType RVar2;
  
  bVar1 = StringTokenizer::hasMoreTokens(tokenizer);
  if (bVar1) {
    RVar2 = StringTokenizer::nextTokenAsDouble(tokenizer);
    *dipoleMoment = RVar2;
    return;
  }
  snprintf(painCave.errMsg,2000,
           "MultipoleAtomTypesSectionParser Error: Not enough tokens at line %d\n",
           (ulong)(uint)lineNo);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void MultipoleAtomTypesSectionParser::parseDipole(StringTokenizer& tokenizer,
                                                    RealType& dipoleMoment,
                                                    int lineNo) {
    if (tokenizer.hasMoreTokens()) {
      dipoleMoment = tokenizer.nextTokenAsDouble();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }